

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O0

yajl_lexer yajl_lex_alloc(yajl_alloc_funcs *alloc,uint allowComments,uint validateUTF8)

{
  yajl_lexer __s;
  yajl_buf pyVar1;
  uint in_EDX;
  uint in_ESI;
  yajl_alloc_funcs *in_RDI;
  yajl_lexer lxr;
  
  __s = (yajl_lexer)(*in_RDI->malloc)(in_RDI->ctx,0x40);
  memset(__s,0,0x40);
  pyVar1 = yajl_buf_alloc((yajl_alloc_funcs *)CONCAT44(in_ESI,in_EDX));
  __s->buf = pyVar1;
  __s->allowComments = in_ESI;
  __s->validateUTF8 = in_EDX;
  __s->alloc = in_RDI;
  return __s;
}

Assistant:

yajl_lexer
yajl_lex_alloc(yajl_alloc_funcs * alloc,
               unsigned int allowComments, unsigned int validateUTF8)
{
    yajl_lexer lxr = (yajl_lexer) YA_MALLOC(alloc, sizeof(struct yajl_lexer_t));
    memset((void *) lxr, 0, sizeof(struct yajl_lexer_t));
    lxr->buf = yajl_buf_alloc(alloc);
    lxr->allowComments = allowComments;
    lxr->validateUTF8 = validateUTF8;
    lxr->alloc = alloc;
    return lxr;
}